

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O1

int __thiscall jbcoin::STTx::sign(STTx *this,PublicKey *publicKey,SecretKey *secretKey)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  uint256 *puVar2;
  pointer *__ptr;
  Buffer sig;
  Blob data;
  uint8_t *local_68;
  size_t local_60;
  Blob local_58;
  uint256 local_40;
  
  getSigningData(&local_58,this);
  local_40.pn._8_8_ =
       (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_40.pn._0_8_ =
       local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  jbcoin::sign((jbcoin *)&local_68,publicKey,secretKey,(Slice *)&local_40);
  local_40.pn._0_8_ = local_68;
  if (local_60 == 0) {
    local_40.pn._0_8_ = (uint8_t *)0x0;
  }
  local_40.pn[2] = (undefined4)local_60;
  local_40.pn[3] = local_60._4_4_;
  STObject::setFieldVL(&this->super_STObject,(SField *)sfTxnSignature,(Slice *)&local_40);
  puVar2 = STObject::getHash(&local_40,&this->super_STObject,HashPrefix::transactionID);
  iVar1 = (int)puVar2;
  *(undefined8 *)((this->tid_).pn + 4) = local_40.pn._16_8_;
  *(undefined8 *)((this->tid_).pn + 6) = local_40.pn._24_8_;
  *(undefined8 *)(this->tid_).pn = local_40.pn._0_8_;
  *(undefined8 *)((this->tid_).pn + 2) = local_40.pn._8_8_;
  if (local_68 != (uint8_t *)0x0) {
    operator_delete__(local_68);
    iVar1 = extraout_EAX;
  }
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar1 = extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

void STTx::sign (
    PublicKey const& publicKey,
    SecretKey const& secretKey)
{
    auto const data = getSigningData (*this);

    auto const sig = jbcoin::sign (
        publicKey,
        secretKey,
        makeSlice(data));

    setFieldVL (sfTxnSignature, sig);
    tid_ = getHash(HashPrefix::transactionID);
}